

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O1

err_t cmdFilePrepend(char *name,void *buf,size_t count)

{
  bool_t bVar1;
  err_t eVar2;
  file_t pFVar3;
  size_t offset;
  blob_t buf_00;
  size_t sVar4;
  bool bVar5;
  size_t c;
  size_t local_48;
  size_t local_40;
  void *local_38;
  
  local_40 = count;
  pFVar3 = fileOpen(name,"r+b");
  if (pFVar3 == (file_t)0x0) {
    pFVar3 = fileOpen(name,"rb");
    if (pFVar3 == (file_t)0x0) {
      eVar2 = cmdFileWrite(name,buf,local_40);
      return eVar2;
    }
    fileClose(pFVar3);
    eVar2 = 0xcb;
  }
  else {
    offset = fileSize(pFVar3);
    if (offset == 0xffffffffffffffff) {
      fileClose(pFVar3);
      eVar2 = 0xcf;
    }
    else {
      buf_00 = blobCreate(0x1000);
      if (buf_00 == (blob_t)0x0) {
        fileClose(pFVar3);
        eVar2 = 0x6e;
      }
      else {
        local_38 = buf;
        if (offset == 0) {
          bVar5 = true;
          eVar2 = 0;
        }
        else {
          do {
            local_48 = 0x1000;
            if (offset < 0x1000) {
              local_48 = offset;
            }
            offset = offset - local_48;
            bVar1 = fileSeek(pFVar3,offset,0);
            eVar2 = 0xcf;
            if (((bVar1 != 0) && (sVar4 = fileRead2(buf_00,local_48,pFVar3), sVar4 == local_48)) &&
               (bVar1 = fileSeek(pFVar3,local_40 + offset,0), bVar1 != 0)) {
              eVar2 = fileWrite(&local_48,buf_00,local_48,pFVar3);
            }
            bVar5 = eVar2 == 0;
          } while ((bVar5) && (offset != 0));
        }
        blobClose(buf_00);
        if (bVar5) {
          bVar1 = fileSeek(pFVar3,0,0);
          if (bVar1 == 0) {
            eVar2 = 0xcf;
          }
          else {
            eVar2 = fileWrite(&local_40,local_38,local_40,pFVar3);
          }
          bVar1 = fileClose(pFVar3);
          if ((eVar2 == 0) && (eVar2 = 0x67, bVar1 != 0)) {
            eVar2 = 0;
          }
        }
        else {
          fileClose(pFVar3);
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t cmdFilePrepend(const char* name, const void* buf, size_t count)
{
	const size_t buf1_size = 4096;
	err_t code;
	file_t file;
	size_t size;
	size_t pos;
	void* buf1;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(buf, count));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	if (code != ERR_OK)
	{
		// не открывается, но существует?
		code = cmdFileOpen(file, name, "rb");
		if (code == ERR_OK)
		{
			cmdFileClose(file);
			return ERR_FILE_OPEN;
		}
		// не существует => создать
		return cmdFileWrite(name, buf, count);
	}
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
	{
		cmdFileClose(file);
		return ERR_FILE_READ;
	}
	// сдвинуть содержимое файла вправо
	code = cmdBlobCreate(buf1, buf1_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	for (pos = size; code == ERR_OK && pos;)
	{
		size_t c;
		c = MIN2(buf1_size, pos), pos -= c;
		if (!fileSeek(file, pos, SEEK_SET) ||
			fileRead2(buf1, c, file) != c ||
			!fileSeek(file, pos + count, SEEK_SET))
			code = ERR_FILE_READ;
		else
			code = fileWrite(&c, buf1, c, file);
	}
	cmdBlobClose(buf1);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// дописать в начало
	if (!fileSeek(file, 0, SEEK_SET))
		code = ERR_FILE_READ;
	else
		code = fileWrite(&count, buf, count, file);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}